

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charfreqs.cpp
# Opt level: O1

void exportJSON(FILE *out,long rows,long columns,double *counts,bool do_prot)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  fputc(0x7b,(FILE *)out);
  if (0 < rows && counts != (double *)0x0) {
    lVar4 = 0;
    bVar6 = false;
    do {
      if (columns < 1) {
        bVar1 = true;
      }
      else {
        bVar1 = true;
        lVar3 = 0;
        do {
          if (0.0 < counts[lVar3]) {
            if (bVar1) {
              uVar5 = 0x20;
              if (bVar6) {
                uVar5 = 0x2c;
              }
              cVar2 = unmap_char((uchar)lVar3,do_prot);
              bVar6 = true;
              fprintf((FILE *)out,"%c\n\t\"%ld\" : {\"%c\" : %g",counts[lVar3],(ulong)uVar5,
                      lVar4 + 1,(ulong)(uint)(int)cVar2);
              bVar1 = false;
            }
            else {
              cVar2 = unmap_char((uchar)lVar3,do_prot);
              fprintf((FILE *)out,", \"%c\" : %g",counts[lVar3],(ulong)(uint)(int)cVar2);
            }
          }
          lVar3 = lVar3 + 1;
        } while (columns != lVar3);
      }
      if (!bVar1) {
        fputc(0x7d,(FILE *)out);
      }
      lVar4 = lVar4 + 1;
      counts = counts + columns;
    } while (lVar4 != rows);
  }
  fwrite("\n}\n",3,1,(FILE *)out);
  return;
}

Assistant:

void exportJSON (FILE* out, long rows, long columns, const double* counts, bool do_prot) {
  fprintf (out, "{");
  
  if (counts) {
    bool do_comma = false;
    for (long r = 0; r < rows; r++) {
      bool first = true;
      for (long c = 0; c < columns; c++) {
        if (counts [r*columns + c] > 0.0) {
          if (first) {
            fprintf (out, "%c\n\t\"%ld\" : {\"%c\" : %g", do_comma ? ',' : ' ', r + 1, unmap_char(c,do_prot), counts[r*columns+c]);
            do_comma = true;
            first = false;
          } else {
            fprintf (out, ", \"%c\" : %g", unmap_char(c,do_prot) , counts[r*columns+c]);
          }
        }
      }
      if (!first) {
        fprintf (out, "}");
      }
    }
  }
  
  fprintf (out, "\n}\n");
}